

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O0

int amqp_put_back_frame(amqp_connection_state_t state,amqp_frame_t *frame)

{
  amqp_link_t *paVar1;
  amqp_frame_t *in_RDI;
  amqp_link_t *link;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  paVar1 = amqp_create_link_for_frame
                     ((amqp_connection_state_t)
                      CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (paVar1 == (amqp_link_t *)0x0) {
    iVar2 = -1;
  }
  else {
    if (in_RDI[5].payload.method.decoded == (void *)0x0) {
      in_RDI[5].payload.method.decoded = paVar1;
      in_RDI[5].payload.properties.decoded = paVar1;
      paVar1->next = (amqp_link_t_ *)0x0;
    }
    else {
      paVar1->next = (amqp_link_t_ *)in_RDI[5].payload.method.decoded;
      in_RDI[5].payload.method.decoded = paVar1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int amqp_put_back_frame(amqp_connection_state_t state, amqp_frame_t *frame) {
  amqp_link_t *link = amqp_create_link_for_frame(state, frame);
  if (NULL == link) {
    return AMQP_STATUS_NO_MEMORY;
  }

  if (NULL == state->first_queued_frame) {
    state->first_queued_frame = link;
    state->last_queued_frame = link;
    link->next = NULL;
  } else {
    link->next = state->first_queued_frame;
    state->first_queued_frame = link;
  }

  return AMQP_STATUS_OK;
}